

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

void __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::~InnerMap
          (InnerMap *this)

{
  if (((this->alloc_).arena_ == (Arena *)0x0) && (this->num_buckets_ != 1)) {
    clear(this);
    if ((this->alloc_).arena_ == (Arena *)0x0) {
      operator_delete(this->table_);
      return;
    }
  }
  return;
}

Assistant:

~InnerMap() {
      if (alloc_.arena() == nullptr &&
          num_buckets_ != internal::kGlobalEmptyTableSize) {
        clear();
        Dealloc<void*>(table_, num_buckets_);
      }
    }